

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

void __thiscall
testing::internal::DeathTestImpl::DeathTestImpl
          (DeathTestImpl *this,char *a_statement,
          Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          *matcher)

{
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *matcher_local;
  char *a_statement_local;
  DeathTestImpl *this_local;
  
  DeathTest::DeathTest(&this->super_DeathTest);
  (this->super_DeathTest)._vptr_DeathTest = (_func_int **)&PTR__DeathTestImpl_00190a60;
  this->statement_ = a_statement;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  Matcher(&this->matcher_,matcher);
  this->spawned_ = false;
  this->status_ = -1;
  this->outcome_ = IN_PROGRESS;
  this->read_fd_ = -1;
  this->write_fd_ = -1;
  return;
}

Assistant:

DeathTestImpl(const char* a_statement, Matcher<const std::string&> matcher)
      : statement_(a_statement),
        matcher_(std::move(matcher)),
        spawned_(false),
        status_(-1),
        outcome_(IN_PROGRESS),
        read_fd_(-1),
        write_fd_(-1) {}